

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall Sintatico::condicional(Sintatico *this)

{
  bool bVar1;
  
  eat(this,0x1f);
  expressao(this);
  eat(this,0x20);
  comando_sem_rotulo(this);
  bVar1 = Tokens::isEqual((Tokens *)this,this->tok,0x21);
  if (bVar1) {
    eat(this,0x21);
    comando_sem_rotulo(this);
    return;
  }
  return;
}

Assistant:

void Sintatico::condicional() {
  eat(IF);
  expressao();
  eat(THEN);
  comando_sem_rotulo();
  if (isEqual(tok, ELSE)){
    eat(ELSE);
    comando_sem_rotulo();
  }
}